

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

void HTS_PStream_gv_parmgen(HTS_PStream *pst,size_t m)

{
  HTS_PStream *in_RSI;
  HTS_PStream *in_RDI;
  double dVar1;
  double obj;
  double prev;
  double step;
  size_t i;
  size_t t;
  double local_30;
  double local_28;
  ulong local_20;
  size_t in_stack_ffffffffffffffe8;
  ulong uVar2;
  
  local_28 = 0.1;
  local_30 = 0.0;
  if (in_RDI->gv_length != 0) {
    HTS_PStream_conv_gv(in_RSI,in_stack_ffffffffffffffe8);
    HTS_PStream_calc_wuw_and_wum(in_RDI,(size_t)in_RSI);
    for (local_20 = 1; local_20 < 6; local_20 = local_20 + 1) {
      dVar1 = HTS_PStream_calc_derivative(pst,m);
      if (1 < local_20) {
        if (local_30 < dVar1) {
          local_28 = local_28 * 0.5;
        }
        if (dVar1 < local_30) {
          local_28 = local_28 * 1.2;
        }
      }
      for (uVar2 = 0; uVar2 < in_RDI->length; uVar2 = uVar2 + 1) {
        if (in_RDI->gv_switch[uVar2] != '\0') {
          in_RDI->par[uVar2][(long)in_RSI] =
               local_28 * (in_RDI->sm).g[uVar2] + in_RDI->par[uVar2][(long)in_RSI];
        }
      }
      local_30 = dVar1;
    }
  }
  return;
}

Assistant:

static void HTS_PStream_gv_parmgen(HTS_PStream * pst, size_t m)
{
   size_t t, i;
   double step = STEPINIT;
   double prev = 0.0;
   double obj;

   if (pst->gv_length == 0)
      return;

   HTS_PStream_conv_gv(pst, m);
   if (GV_MAX_ITERATION > 0) {
      HTS_PStream_calc_wuw_and_wum(pst, m);
      for (i = 1; i <= GV_MAX_ITERATION; i++) {
         obj = HTS_PStream_calc_derivative(pst, m);
         if (i > 1) {
            if (obj > prev)
               step *= STEPDEC;
            if (obj < prev)
               step *= STEPINC;
         }
         for (t = 0; t < pst->length; t++) {
            if (pst->gv_switch[t])
               pst->par[t][m] += step * pst->sm.g[t];
         }
         prev = obj;
      }
   }
}